

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morse.cpp
# Opt level: O2

void __thiscall
OpenMD::Morse::addExplicitInteraction
          (Morse *this,AtomType *atype1,AtomType *atype2,RealType De,RealType Re,RealType beta,
          MorseType mt)

{
  pointer pvVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar9;
  int atid2;
  int atid1;
  int local_48;
  int local_44;
  RealType local_40;
  RealType local_38;
  RealType local_30;
  
  local_40 = De;
  local_38 = Re;
  local_30 = beta;
  local_44 = AtomType::getIdent(atype1);
  local_48 = AtomType::getIdent(atype2);
  pVar9 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->Mtypes,&local_44);
  if (pVar9.second == false) {
    iVar6 = (this->Mtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_44];
  }
  else {
    iVar6 = this->nM_;
    (this->Mtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_44] = iVar6;
    this->nM_ = iVar6 + 1;
  }
  pVar9 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->Mtypes,&local_48);
  if (pVar9.second == false) {
    iVar7 = (this->Mtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_48];
    iVar3 = this->nM_;
  }
  else {
    iVar7 = this->nM_;
    (this->Mtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_48] = iVar7;
    iVar3 = iVar7 + 1;
    this->nM_ = iVar3;
  }
  std::
  vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
  ::resize(&this->MixingMap,(long)iVar3);
  lVar8 = (long)iVar6;
  std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar8,(long)this->nM_);
  pvVar1 = (this->MixingMap).
           super__Vector_base<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)iVar7;
  lVar2 = *(long *)&pvVar1[lVar8].
                    super__Vector_base<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar5 = lVar4 * 0x20;
  *(RealType *)(lVar2 + lVar5) = local_40;
  *(RealType *)(lVar2 + 8 + lVar5) = local_38;
  *(RealType *)(lVar2 + 0x10 + lVar5) = local_30;
  *(MorseType *)(lVar2 + 0x18 + lVar5) = mt;
  if (iVar7 != iVar6) {
    std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>::resize
              (pvVar1 + lVar4,(long)this->nM_);
    lVar2 = *(long *)&(this->MixingMap).
                      super__Vector_base<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar4].
                      super__Vector_base<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>
                      ._M_impl.super__Vector_impl_data;
    lVar8 = lVar8 * 0x20;
    *(RealType *)(lVar2 + lVar8) = local_40;
    *(RealType *)(lVar2 + 8 + lVar8) = local_38;
    *(RealType *)(lVar2 + 0x10 + lVar8) = local_30;
    *(MorseType *)(lVar2 + 0x18 + lVar8) = mt;
  }
  return;
}

Assistant:

void Morse::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                     RealType De, RealType Re, RealType beta,
                                     MorseType mt) {
    MorseInteractionData mixer;
    mixer.De      = De;
    mixer.Re      = Re;
    mixer.beta    = beta;
    mixer.variant = mt;

    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();

    int mtid1, mtid2;

    pair<set<int>::iterator, bool> ret;
    ret = Mtypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the Mtypes list, just get the mtid:
      mtid1 = Mtids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      mtid1        = nM_;
      Mtids[atid1] = nM_;
      nM_++;
    }
    ret = Mtypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the Mtypes list, just get the mtid:
      mtid2 = Mtids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      mtid2        = nM_;
      Mtids[atid2] = nM_;
      nM_++;
    }

    MixingMap.resize(nM_);
    MixingMap[mtid1].resize(nM_);
    MixingMap[mtid1][mtid2] = mixer;
    if (mtid2 != mtid1) {
      MixingMap[mtid2].resize(nM_);
      MixingMap[mtid2][mtid1] = mixer;
    }
  }